

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O2

bool VulkanUtilities::SetupDebugReport
               (VkInstance instance,VkDebugReportFlagBitsEXT flags,void *pUserData)

{
  int iVar1;
  bool bVar2;
  string msg;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong local_38;
  code *local_30;
  void *local_28;
  
  (anonymous_namespace)::CreateDebugReportCallbackEXT =
       (*vkGetInstanceProcAddr)(instance,"vkCreateDebugReportCallbackEXT");
  (anonymous_namespace)::DestroyDebugReportCallbackEXT =
       (*vkGetInstanceProcAddr)(instance,"vkDestroyDebugReportCallbackEXT");
  if ((anonymous_namespace)::DestroyDebugReportCallbackEXT == (PFN_vkVoidFunction)0x0 ||
      (anonymous_namespace)::CreateDebugReportCallbackEXT == (PFN_vkVoidFunction)0x0) {
    bVar2 = false;
  }
  else {
    uStack_40 = 0;
    local_48 = 0x3b9af4f8;
    local_38 = (ulong)flags;
    local_30 = anon_unknown_0::DebugReportCallback;
    local_28 = pUserData;
    iVar1 = (*(anonymous_namespace)::CreateDebugReportCallbackEXT)
                      (instance,&local_48,0,&(anonymous_namespace)::DbgCallback);
    bVar2 = iVar1 == 0;
    if (!bVar2) {
      Diligent::FormatString<char[39]>
                (&local_68,(char (*) [39])"Failed to create debug report callback");
      Diligent::DebugAssertionFailed
                (local_68._M_dataplus._M_p,"SetupDebugReport",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanDebug.cpp"
                 ,0x108);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  return bVar2;
}

Assistant:

bool SetupDebugReport(VkInstance               instance,
                      VkDebugReportFlagBitsEXT flags,
                      void*                    pUserData)
{
    CreateDebugReportCallbackEXT  = reinterpret_cast<PFN_vkCreateDebugReportCallbackEXT>(vkGetInstanceProcAddr(instance, "vkCreateDebugReportCallbackEXT"));
    DestroyDebugReportCallbackEXT = reinterpret_cast<PFN_vkDestroyDebugReportCallbackEXT>(vkGetInstanceProcAddr(instance, "vkDestroyDebugReportCallbackEXT"));
    if (CreateDebugReportCallbackEXT == nullptr || DestroyDebugReportCallbackEXT == nullptr)
        return false;

    VkDebugReportCallbackCreateInfoEXT CallbackCI{};
    CallbackCI.sType       = VK_STRUCTURE_TYPE_DEBUG_REPORT_CALLBACK_CREATE_INFO_EXT;
    CallbackCI.pNext       = nullptr;
    CallbackCI.flags       = flags;
    CallbackCI.pfnCallback = DebugReportCallback;
    CallbackCI.pUserData   = pUserData;

    auto err = CreateDebugReportCallbackEXT(instance, &CallbackCI, nullptr, &DbgCallback);
    VERIFY(err == VK_SUCCESS, "Failed to create debug report callback");
    return err == VK_SUCCESS;
}